

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
QuantifierMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
::MatchAndExplainImpl
          (QuantifierMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
           *this,bool all_elements_should_match,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *container,MatchResultListener *listener)

{
  bool bVar1;
  undefined8 uVar2;
  const_iterator pvVar3;
  MatchResultListener *pMVar4;
  ostream *os;
  string local_220;
  char *local_200 [3];
  byte local_1e1;
  undefined1 local_1e0 [7];
  bool matches;
  StringMatchResultListener inner_listener;
  const_iterator it;
  size_t i;
  StlContainerReference stl_container;
  MatchResultListener *listener_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *container_local;
  QuantifierMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
  *pQStack_18;
  bool all_elements_should_match_local;
  QuantifierMatcherImpl<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
  *this_local;
  
  stl_container = (StlContainerReference)listener;
  listener_local = (MatchResultListener *)container;
  container_local._7_1_ = all_elements_should_match;
  pQStack_18 = this;
  i = (size_t)StlContainerView<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_>
              ::ConstReference(container);
  it = (const_iterator)0x0;
  for (inner_listener._400_8_ =
            std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
            ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                     *)i); uVar2 = inner_listener._400_8_,
      pvVar3 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
               ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      *)i), (const_iterator)uVar2 != pvVar3;
      inner_listener._400_8_ = inner_listener._400_8_ + 0x20) {
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1e0);
    local_1e1 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::MatchAndExplain(&(this->inner_matcher_).
                                   super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)inner_listener._400_8_,(MatchResultListener *)local_1e0);
    if (local_1e1 == (container_local._7_1_ & 1)) {
      bVar1 = false;
    }
    else {
      pMVar4 = MatchResultListener::operator<<
                         ((MatchResultListener *)stl_container,(char (*) [16])"whose element #");
      pMVar4 = MatchResultListener::operator<<(pMVar4,(unsigned_long *)&it);
      local_200[0] = " doesn\'t match";
      if ((local_1e1 & 1) != 0) {
        local_200[0] = " matches";
      }
      MatchResultListener::operator<<(pMVar4,local_200);
      StringMatchResultListener::str_abi_cxx11_(&local_220,(StringMatchResultListener *)local_1e0);
      os = MatchResultListener::stream((MatchResultListener *)stl_container);
      PrintIfNotEmpty(&local_220,os);
      std::__cxx11::string::~string((string *)&local_220);
      this_local._7_1_ = (container_local._7_1_ ^ 0xff) & 1;
      bVar1 = true;
    }
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1e0);
    if (bVar1) goto LAB_00132a3a;
    it = (const_iterator)&it->field_0x1;
  }
  this_local._7_1_ = container_local._7_1_ & 1;
LAB_00132a3a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MatchAndExplainImpl(bool all_elements_should_match,
                           Container container,
                           MatchResultListener* listener) const {
    StlContainerReference stl_container = View::ConstReference(container);
    size_t i = 0;
    for (typename StlContainer::const_iterator it = stl_container.begin();
         it != stl_container.end(); ++it, ++i) {
      StringMatchResultListener inner_listener;
      const bool matches = inner_matcher_.MatchAndExplain(*it, &inner_listener);

      if (matches != all_elements_should_match) {
        *listener << "whose element #" << i
                  << (matches ? " matches" : " doesn't match");
        PrintIfNotEmpty(inner_listener.str(), listener->stream());
        return !all_elements_should_match;
      }
    }
    return all_elements_should_match;
  }